

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  uint *puVar1;
  curl_usessl cVar2;
  void *pvVar3;
  long lVar4;
  connectdata *pcVar5;
  uint uVar6;
  _Bool _Var7;
  CURLcode CVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  imapstate iVar12;
  curl_socket_t sockfd;
  size_t sVar13;
  size_t maxlen;
  char *pcVar14;
  Curl_easy *pCVar15;
  size_t sVar16;
  byte *ptr;
  Curl_easy *pCVar17;
  smtp_conn *smtpc;
  int smtpcode;
  size_t nread;
  uint local_60;
  curl_socket_t local_5c;
  Curl_easy *local_58;
  Curl_easy *local_50;
  saslprogress local_48;
  undefined4 uStack_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  pCVar17 = conn->data;
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE) {
    CVar8 = smtp_perform_upgrade_tls(conn);
    return CVar8;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar8;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.state;
  local_50 = pCVar17;
  do {
    CVar8 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_60,&local_38);
    uVar6 = local_60;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar12 = (conn->proto).imapc.state;
    if (local_60 != 1 && iVar12 != IMAP_APPEND_FINAL) {
      (pCVar17->info).httpcode = local_60;
    }
    if (local_60 == 0) {
      return CURLE_OK;
    }
    switch(iVar12) {
    case IMAP_SERVERGREET:
      if (99 < local_60 - 200) {
        Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)local_60);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      CVar8 = smtp_perform_ehlo(conn);
      break;
    case IMAP_CAPABILITY:
      pCVar15 = conn->data;
      if (0xffffff9b < local_60 - 300 || local_60 == 1) {
        pcVar14 = (pCVar15->state).buffer;
        local_58 = pCVar15;
        sVar10 = strlen(pcVar14);
        uVar11 = sVar10 - 4;
        pCVar15 = local_58;
        if (uVar11 < 8) {
          if (3 < uVar11) goto LAB_00134656;
        }
        else if (*(long *)(pcVar14 + 4) == 0x534c545452415453) {
          (conn->proto).imapc.resptag[0] = '\x01';
        }
        else {
LAB_00134656:
          if (*(int *)(pcVar14 + 4) == 0x455a4953) {
            (conn->proto).imapc.resptag[1] = '\x01';
          }
          else if ((4 < uVar11) && (pcVar14[8] == ' ' && *(int *)(pcVar14 + 4) == 0x48545541)) {
            (conn->proto).imapc.resptag[2] = '\x01';
            sVar16 = sVar10 - 9;
            if (sVar16 != 0) {
              ptr = (byte *)(pcVar14 + 9);
              local_5c = sockfd;
              do {
                while (((ulong)*ptr < 0x21 && ((0x100002600U >> ((ulong)*ptr & 0x3f) & 1) != 0))) {
                  ptr = ptr + 1;
                  sVar16 = sVar16 - 1;
                  if (sVar16 == 0) goto LAB_0013477a;
                }
                sVar13 = 0;
                do {
                  if (((ulong)ptr[sVar13] < 0x21) &&
                     (maxlen = sVar13, (0x100002600U >> ((ulong)ptr[sVar13] & 0x3f) & 1) != 0))
                  break;
                  sVar13 = sVar13 + 1;
                  maxlen = sVar16;
                } while (sVar16 != sVar13);
                uVar9 = Curl_sasl_decode_mech((char *)ptr,maxlen,(size_t *)&local_48);
                if ((uVar9 != 0) && (CONCAT44(uStack_44,local_48) == maxlen)) {
                  puVar1 = (uint *)((long)&conn->proto + 0x8c);
                  *puVar1 = *puVar1 | uVar9;
                }
                ptr = ptr + maxlen;
                sVar16 = sVar16 - maxlen;
                pCVar15 = local_58;
                sockfd = local_5c;
              } while (sVar16 != 0);
            }
          }
        }
LAB_0013477a:
        pCVar17 = local_50;
        if (uVar6 != 1) {
          cVar2 = (pCVar15->set).use_ssl;
          if ((cVar2 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).imapc.resptag[0] == '\x01') {
              CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
              iVar12 = IMAP_UPGRADETLS;
              goto LAB_00134625;
            }
            if (cVar2 != CURLUSESSL_TRY) {
              Curl_failf(pCVar15,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
LAB_0013457f:
          CVar8 = smtp_perform_authentication(conn);
          break;
        }
        goto LAB_0013474a;
      }
      if ((CURLUSESSL_TRY < (pCVar15->set).use_ssl) && (conn->ssl[0].use != true))
      goto LAB_001348da;
      (conn->proto).ftpc.cwdcount = 0;
      CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
      iVar12 = IMAP_STARTTLS;
LAB_00134625:
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      (conn->proto).imapc.state = iVar12;
      goto LAB_00134757;
    case IMAP_STARTTLS:
      if (99 < local_60 - 200) {
        pCVar15 = conn->data;
LAB_001348da:
        Curl_failf(pCVar15,"Remote access denied: %d",(ulong)local_60);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    default:
switchD_0013438b_caseD_5:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_UPGRADETLS:
      if (local_60 != 0xdc) {
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied, code %d",(ulong)local_60);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_0013457f;
      }
      CVar8 = smtp_perform_upgrade_tls(conn);
      break;
    case IMAP_LOGIN:
      pCVar15 = conn->data;
      CVar8 = Curl_sasl_continue(local_40,conn,local_60,&local_48);
      if (CVar8 == CURLE_OK) {
        if (local_48 == SASL_IDLE) {
          Curl_failf(pCVar15,"Authentication cancelled");
          CVar8 = CURLE_LOGIN_DENIED;
        }
        else {
          CVar8 = CURLE_OK;
          if (local_48 == SASL_DONE) {
            (conn->proto).imapc.state = IMAP_STOP;
          }
        }
      }
      break;
    case IMAP_LIST:
      pCVar17 = conn->data;
      pCVar15 = (Curl_easy *)(pCVar17->req).protop;
      pcVar14 = (pCVar17->state).buffer;
      local_5c = sockfd;
      sVar10 = strlen(pcVar14);
      local_58 = pCVar15;
      if ((uVar6 - 300 < 0xffffff9c) && (pCVar15->easy_conn != (connectdata *)0x0)) {
        if ((uVar6 != 1) && (uVar6 != 0x229)) {
LAB_001348a4:
          Curl_failf(pCVar17,"Command failed: %d",(ulong)uVar6);
          return CURLE_RECV_ERROR;
        }
      }
      else if ((uVar6 - 300 < 0xffffff9c) &&
              ((uVar6 != 1 && (pCVar15->easy_conn == (connectdata *)0x0)))) goto LAB_001348a4;
      CVar8 = CURLE_OK;
      if ((pCVar17->set).opt_no_body == false) {
        pcVar14[sVar10] = '\n';
        CVar8 = Curl_client_write(conn,1,pcVar14,sVar10 + 1);
        pcVar14[sVar10] = '\0';
      }
      pCVar17 = local_50;
      sockfd = local_5c;
      if (uVar6 != 1) {
        if ((local_58->easy_conn == (connectdata *)0x0) ||
           (pcVar5 = (connectdata *)(local_58->easy_conn->bundle_node).ptr,
           local_58->easy_conn = pcVar5, pcVar5 == (connectdata *)0x0)) {
          (conn->proto).imapc.state = IMAP_STOP;
        }
        else {
          CVar8 = smtp_perform_command(conn);
        }
      }
      break;
    case IMAP_SELECT:
      if (99 < local_60 - 200) {
        pCVar15 = conn->data;
        pcVar14 = "MAIL failed: %d";
LAB_001348c6:
        Curl_failf(pCVar15,pcVar14,(ulong)local_60);
        return CURLE_SEND_ERROR;
      }
      goto LAB_00134465;
    case IMAP_FETCH:
      pCVar15 = conn->data;
      if (99 < local_60 - 200) {
        pcVar14 = "RCPT failed: %d";
        goto LAB_001348c6;
      }
      pvVar3 = (pCVar15->req).protop;
      lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x10) + 8);
      *(long *)((long)pvVar3 + 0x10) = lVar4;
      if (lVar4 == 0) {
        CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
        iVar12 = IMAP_FETCH_FINAL;
        goto LAB_00134625;
      }
LAB_00134465:
      CVar8 = smtp_perform_rcpt_to(conn);
      break;
    case IMAP_FETCH_FINAL:
      pCVar15 = conn->data;
      if (local_60 != 0x162) {
        pcVar14 = "DATA failed: %d";
        goto LAB_001348c6;
      }
      Curl_pgrsSetUploadSize(pCVar15,(pCVar15->state).infilesize);
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
      goto switchD_0013438b_caseD_5;
    case IMAP_APPEND:
      (conn->proto).imapc.state = IMAP_STOP;
      if (local_60 == 0xfa) {
        return CURLE_OK;
      }
      return CURLE_RECV_ERROR;
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
LAB_0013474a:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00134757:
    _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}